

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::createTexture_mix(SemanticParser *this,SP *in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  element_type *this_00;
  element_type *this_01;
  element_type *this_02;
  element_type *peVar3;
  bool bVar4;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  float fVar6;
  SP SVar7;
  string local_a8;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  undefined1 local_78 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Base_ptr local_48;
  _Base_ptr local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  std::__shared_ptr<pbrt::MixTexture,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pbrt::MixTexture>>
            ((__shared_ptr<pbrt::MixTexture,(__gnu_cxx::_Lock_policy)2> *)&local_88,
             (allocator<pbrt::MixTexture> *)&local_a8);
  lVar2 = *in_RDX;
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"amount","");
  bVar4 = syntactic::ParamSet::hasParam3f((ParamSet *)(lVar2 + 8),&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  peVar3 = local_88;
  lVar2 = *in_RDX;
  if (bVar4) {
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"amount","");
    syntactic::ParamSet::getParam3f((ParamSet *)(lVar2 + 8),(float *)&peVar3->cameras,&local_a8);
  }
  else {
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"amount","");
    bVar4 = syntactic::ParamSet::hasParam1f((ParamSet *)(lVar2 + 8),&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      lVar2 = *in_RDX;
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"amount","");
      fVar6 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar2 + 8),&local_a8,0.0);
      *(float *)&(local_88->cameras).
                 super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                 ._M_impl.super__Vector_impl_data._M_start = fVar6;
      *(float *)((long)&(local_88->cameras).
                        super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                        ._M_impl.super__Vector_impl_data + 4) = fVar6;
      *(float *)((long)&(local_88->cameras).
                        super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                        ._M_impl.super__Vector_impl_data + 8) = fVar6;
    }
    else {
      lVar2 = *in_RDX;
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"amount","");
      syntactic::ParamSet::getParamTexture
                ((ParamSet *)&stack0xffffffffffffffc0,(string *)(lVar2 + 8));
      findOrCreateTexture((SemanticParser *)local_78,in);
      this_01 = (local_88->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *(undefined8 *)
       ((long)&(local_88->cameras).
               super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
               ._M_impl.super__Vector_impl_data + 0x10) = local_78._0_8_;
      (local_88->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_78._8_8_;
      if (this_01 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
      if (local_38 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  lVar2 = *in_RDX;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex1","");
  bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)(lVar2 + 8),&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    lVar2 = *in_RDX;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex1","");
    syntactic::ParamSet::getParamTexture((ParamSet *)&stack0xffffffffffffffb0,(string *)(lVar2 + 8))
    ;
    findOrCreateTexture((SemanticParser *)local_78,in);
    this_00 = (local_88->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    (local_88->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._0_8_;
    (local_88->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_78._8_8_;
    if (this_00 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    if (local_48 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
    }
  }
  else {
    lVar2 = *in_RDX;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex1","");
    bVar4 = syntactic::ParamSet::hasParam3f((ParamSet *)(lVar2 + 8),&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    peVar3 = local_88;
    lVar2 = *in_RDX;
    if (bVar4) {
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex1","");
      syntactic::ParamSet::getParam3f
                ((ParamSet *)(lVar2 + 8),
                 (float *)&(peVar3->integrator).
                           super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,&local_a8);
    }
    else {
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex1","");
      fVar6 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar2 + 8),&local_a8,0.0);
      *(float *)&(local_88->integrator).
                 super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = fVar6;
      *(float *)((long)&(local_88->integrator).
                        super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                        ._M_pi + 4) = fVar6;
      *(float *)&(local_88->pixelFilter).
                 super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = fVar6;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  lVar2 = *in_RDX;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex2","");
  bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)(lVar2 + 8),&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    lVar2 = *in_RDX;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex2","");
    syntactic::ParamSet::getParamTexture((ParamSet *)(local_78 + 0x18),(string *)(lVar2 + 8));
    SVar7 = findOrCreateTexture((SemanticParser *)local_78,in);
    _Var5 = SVar7.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    this_02 = (local_88->integrator).
              super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (local_88->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._0_8_;
    (local_88->integrator).super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_78._8_8_;
    if (this_02 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
      _Var5._M_pi = extraout_RDX;
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      _Var5._M_pi = extraout_RDX_00;
    }
  }
  else {
    lVar2 = *in_RDX;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex2","");
    bVar4 = syntactic::ParamSet::hasParam3f((ParamSet *)(lVar2 + 8),&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    peVar3 = local_88;
    lVar2 = *in_RDX;
    if (bVar4) {
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex2","");
      syntactic::ParamSet::getParam3f
                ((ParamSet *)(lVar2 + 8),
                 (float *)((long)&(peVar3->pixelFilter).
                                  super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + 4),&local_a8);
      _Var5._M_pi = extraout_RDX_01;
    }
    else {
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex2","");
      fVar6 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar2 + 8),&local_a8,0.0);
      *(float *)((long)&(local_88->pixelFilter).
                        super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
                ) = fVar6;
      *(float *)&(local_88->pixelFilter).
                 super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = fVar6;
      *(float *)((long)&(local_88->pixelFilter).
                        super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4) = fVar6;
      _Var5._M_pi = extraout_RDX_02;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    _Var5._M_pi = extraout_RDX_03;
  }
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_80;
  SVar7.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  SVar7.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar7.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Texture::SP SemanticParser::createTexture_mix(pbrt::syntactic::Texture::SP in)
  {
    MixTexture::SP tex = std::make_shared<MixTexture>();

    if (in->hasParam3f("amount"))
      in->getParam3f(&tex->amount.x,"amount");
    else if (in->hasParam1f("amount"))
      tex->amount = vec3f(in->getParam1f("amount"));
    else 
      tex->map_amount = findOrCreateTexture(in->getParamTexture("amount"));
          
    if (in->hasParamTexture("tex1"))
      tex->tex1 = findOrCreateTexture(in->getParamTexture("tex1"));
    else if (in->hasParam3f("tex1"))
      in->getParam3f(&tex->scale1.x,"tex1");
    else
      tex->scale1 = vec3f(in->getParam1f("tex1"));
          
    if (in->hasParamTexture("tex2"))
      tex->tex2 = findOrCreateTexture(in->getParamTexture("tex2"));
    else if (in->hasParam3f("tex2"))
      in->getParam3f(&tex->scale2.x,"tex2");
    else
      tex->scale2 = vec3f(in->getParam1f("tex2"));
    return tex;
  }